

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

void byte_swap(BigArrayIter *iter,size_t nmemb)

{
  undefined1 uVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  char ndtype [8];
  char acStack_38 [2];
  char local_36 [6];
  
  _dtype_normalize(acStack_38,iter->array->dtype);
  iVar3 = atoi(local_36);
  if ((iVar3 != 1) && (nmemb != 0)) {
    sVar6 = 0;
    do {
      if (0 < iVar3 >> 1) {
        pvVar2 = iter->dataptr;
        uVar5 = 0;
        iVar4 = iVar3;
        do {
          iVar4 = iVar4 + -1;
          uVar1 = *(undefined1 *)((long)pvVar2 + uVar5);
          *(undefined1 *)((long)pvVar2 + uVar5) = *(undefined1 *)((long)pvVar2 + (long)iVar4);
          *(undefined1 *)((long)pvVar2 + (long)iVar4) = uVar1;
          uVar5 = uVar5 + 1;
        } while ((uint)(iVar3 >> 1) != uVar5);
      }
      big_array_iter_advance(iter);
      sVar6 = sVar6 + 1;
    } while (sVar6 != nmemb);
  }
  return;
}

Assistant:

static void
byte_swap(BigArrayIter * iter, size_t nmemb)
{
    /* swap a buffer in-place */
    int elsize = big_file_dtype_itemsize(iter->array->dtype);
    if(elsize == 1) return;
    /* need byte swap; do it now on buf2 */
    /* XXX: this may still be wrong. */
    ptrdiff_t i;
    int half = elsize >> 1;
    for(i = 0; i < nmemb; i ++) {
        int j;
        char * ptr = iter->dataptr;
        for(j = 0; j < half; j ++) {
            char tmp = ptr[j];
            ptr[j] = ptr[elsize - j - 1];
            ptr[elsize - j - 1] = tmp;
        }
        big_array_iter_advance(iter);
    }
}